

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

int scope_metadata_array_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long lVar1;
  long lVar2;
  type_id tVar3;
  function func;
  value pvVar4;
  klass cls;
  object obj;
  long lVar5;
  long *plVar6;
  
  tVar3 = value_type_id(val);
  if (tVar3 == 0x10) {
    obj = value_to_object(val);
    pvVar4 = object_metadata(obj);
    plVar6 = (long *)((long)args + 0x10);
    lVar5 = 0x28;
  }
  else if (tVar3 == 0xf) {
    cls = value_to_class(val);
    pvVar4 = class_metadata(cls);
    plVar6 = (long *)((long)args + 8);
    lVar5 = 0x20;
  }
  else {
    if (tVar3 != 0xd) {
      return 0;
    }
    func = value_to_function(val);
    pvVar4 = function_metadata(func);
    lVar5 = 0x18;
    plVar6 = (long *)args;
  }
  lVar1 = *plVar6;
  lVar2 = *(long *)((long)args + lVar5);
  *(long *)((long)args + lVar5) = lVar2 + 1;
  *(value *)(lVar1 + lVar2 * 8) = pvVar4;
  return 0;
}

Assistant:

int scope_metadata_array_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_metadata_array_cb_iterator metadata_iterator = (scope_metadata_array_cb_iterator)args;

	(void)s;
	(void)key;

	int type_id = value_type_id(val);

	if (type_id == TYPE_FUNCTION)
	{
		metadata_iterator->functions[metadata_iterator->functions_size++] = function_metadata(value_to_function(val));
	}
	else if (type_id == TYPE_CLASS)
	{
		metadata_iterator->classes[metadata_iterator->classes_size++] = class_metadata(value_to_class(val));
	}
	else if (type_id == TYPE_OBJECT)
	{
		metadata_iterator->objects[metadata_iterator->objects_size++] = object_metadata(value_to_object(val));
	}

	return 0;
}